

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_allocator.h
# Opt level: O3

pointer __thiscall
cppcms::impl::basic_allocator<$7099d3de$>::allocate
          (basic_allocator<_7099d3de_> *this,size_type cnt,const_pointer param_2)

{
  pointer p_Var1;
  undefined8 *puVar2;
  
  p_Var1 = (pointer)shmem_allocator<$ae3002f$>::malloc((shmem_allocator<_ae3002f_> *)this,cnt << 5);
  if (p_Var1 != (pointer)0x0) {
    return p_Var1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = booster::log::logger::instance;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

pointer allocate(size_type cnt, std::allocator<void>::const_pointer = 0) const
	{
		void *memory=self().malloc(cnt*sizeof(T));
		if(!memory) {
			throw std::bad_alloc();
		}
		return (pointer)memory;
	}